

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

void ReadBufLine(bool Parse,bool SplitByColon)

{
  char cVar1;
  uint32_t uVar2;
  uint uVar3;
  pointer pTVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  size_t sVar12;
  char *pcVar13;
  uint uVar14;
  size_t advanceColumns;
  uint uVar15;
  
  line[0] = '\0';
  if (IsRunning != 0) {
    while (bVar6 = ReadBufData(), bVar6) {
      eolComment = (char *)0x0;
      rlppos = line;
      substitutedLine = line;
      bVar6 = colonSubline != true;
      if (!bVar6) {
        colonSubline = false;
        rlppos = line + 1;
        line[0] = ' ';
      }
      bVar6 = bVar6 && blockComment == 0;
      bVar9 = true;
LAB_001278d5:
      bVar7 = ReadBufData();
      if (bVar7) {
        bVar10 = *rlpbuf;
        if (((bVar10 == 10) || (bVar10 == 0xd)) ||
           ((blockComment == 0 && (bVar10 == 0x3a && (rlppos != line && SplitByColon)))))
        goto LAB_00127cdb;
        rlpbuf = rlpbuf + 1;
        *rlppos = bVar10;
        iVar11 = isalnum((uint)bVar10);
        bVar7 = iVar11 == 0;
        if (((bVar10 == 0x5c) && (bVar8 = ReadBufData(), bVar8)) &&
           ((bVar10 = *rlpbuf, bVar10 == 0xd || (bVar10 == 10)))) {
          rlpbuf = rlpbuf + 1;
          bVar9 = ReadBufData();
          if ((bVar9) && ((byte)(bVar10 ^ *rlpbuf) == 7)) {
            rlpbuf = rlpbuf + 1;
          }
          TextFilePos::nextSegment
                    (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1,false,0);
          bVar9 = bVar7;
        }
        else if (((*rlppos == '*') && (bVar8 = ReadBufData(), bVar8)) && (*rlpbuf == '/')) {
          if (0 < blockComment) {
            blockComment = blockComment + -1;
          }
          rlpbuf = rlpbuf + 1;
          pcVar13 = rlppos + 1;
          rlppos = rlppos + 2;
          *pcVar13 = '/';
          bVar9 = bVar7;
        }
        else if (((*rlppos == '/') && (bVar8 = ReadBufData(), bVar8)) && (*rlpbuf == '*')) {
          blockComment = blockComment + 1;
          rlpbuf = rlpbuf + 1;
          pcVar13 = rlppos + 1;
          rlppos = rlppos + 2;
          *pcVar13 = '*';
          bVar9 = bVar7;
        }
        else if (blockComment == 0) {
          if ((!bVar6) || (iVar11 = islabchar(*rlppos), iVar11 == 0)) goto LAB_00127b6e;
          rlppos = rlppos + 1;
          bVar6 = true;
          bVar9 = ReadBufData();
          if ((bVar9) && (*rlpbuf == '+')) {
            rlpbuf = rlpbuf + 1;
            pcVar13 = rlppos + 1;
            *rlppos = '+';
            rlppos = pcVar13;
            bVar6 = ReadBufData();
            if ((bVar6) && (bVar10 = *rlpbuf, bVar10 == 0x2a || bVar10 - 0x30 < 10)) {
              rlpbuf = rlpbuf + 1;
              pcVar13 = rlppos + 1;
              *rlppos = bVar10;
              rlppos = pcVar13;
            }
            bVar6 = false;
          }
          bVar8 = ReadBufData();
          bVar9 = bVar7;
          if ((bVar8) && (*rlpbuf == ':')) {
            rlpbuf = rlpbuf + 1;
            pcVar13 = rlppos + 1;
            *rlppos = ':';
            rlppos = pcVar13;
            goto LAB_00127cd0;
          }
        }
        else {
          rlppos = rlppos + 1;
          bVar9 = bVar7;
        }
        goto LAB_001278d5;
      }
LAB_00127cdb:
      *rlppos = '\0';
      bVar6 = ReadBufData();
      if ((bVar6) && ((bVar10 = *rlpbuf, bVar10 == 0xd || (bVar10 == 10)))) {
        rlpbuf = rlpbuf + 1;
        bVar6 = ReadBufData();
        if ((bVar6) && ((byte)(bVar10 ^ *rlpbuf) == 7)) {
          rlpbuf = rlpbuf + 1;
        }
        bVar6 = ReadBufData();
        if ((!bVar6) && (line[0] != '\0')) {
          pcVar13 = rlpbuf_end + 1;
          *rlpbuf_end = '\n';
          rlpbuf_end = pcVar13;
        }
      }
      else if (SplitByColon) {
        bVar6 = ReadBufData();
        if ((bVar6) && (*rlpbuf == ':')) {
          rlpbuf = rlpbuf + 1;
          colonSubline = true;
        }
        else {
          colonSubline = false;
        }
      }
      else {
        colonSubline = false;
      }
      bVar6 = colonSubline;
      pTVar4 = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_start ==
          sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        __assert_fail("!sourcePosStack.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/sjio.cpp"
                      ,0x33c,"void ReadBufLine(bool, bool)");
      }
      if (colonSubline == true) {
        uVar2 = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl
                .super__Vector_impl_data._M_finish[-1].colEnd;
        sVar12 = strlen(line);
        advanceColumns = sVar12 + (uVar2 == 0);
      }
      else {
        advanceColumns = 0;
      }
      TextFilePos::nextSegment(pTVar4 + -1,bVar6,advanceColumns);
      if (!Parse) {
        return;
      }
      ParseLine(true);
      if (IsRunning == 0) {
        return;
      }
    }
  }
  return;
LAB_00127b6e:
  if ((*rlppos == ';') ||
     (((pcVar13 = rlppos, *rlppos == '/' && (bVar6 = ReadBufData(), pcVar13 = rlppos, bVar6)) &&
      (*rlpbuf == '/')))) {
    eolComment = rlppos;
    rlppos = rlppos + 1;
    while (bVar6 = ReadBufData(), bVar6) {
      cVar1 = *rlpbuf;
      bVar6 = false;
      bVar9 = bVar7;
      if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_001278d5;
      rlpbuf = rlpbuf + 1;
      pcVar13 = rlppos + 1;
      *rlppos = cVar1;
      rlppos = pcVar13;
    }
  }
  else {
    if ((bVar9) && ((cVar1 = *pcVar13, cVar1 == '\'' || (cVar1 == '\"')))) {
      uVar15 = 0;
      do {
        uVar3 = uVar15 - 1;
        if (uVar15 == 0) {
          uVar3 = 0;
        }
        rlppos = pcVar13 + 1;
        bVar6 = ReadBufData();
        pcVar13 = rlppos;
        pcVar5 = rlpbuf;
        if (bVar6) {
          bVar10 = *rlpbuf;
          *rlppos = bVar10;
          if ((bVar10 < 0xe) && ((0x2401U >> (bVar10 & 0x1f) & 1) != 0)) goto LAB_00127c8c;
          rlpbuf = pcVar5 + 1;
        }
        else {
          *rlppos = '\0';
LAB_00127c8c:
          *pcVar13 = '\0';
          bVar10 = 0;
        }
        if (bVar10 == 0) goto LAB_00127cd0;
        uVar14 = (uint)(bVar10 == 0x5c) * 2;
        if (1 < uVar15) {
          uVar14 = uVar3;
        }
        uVar15 = uVar14;
        if (cVar1 != '\"') {
          uVar15 = uVar3;
        }
      } while ((uVar15 != 0) || ((uint)(cVar1 != '\"') * 5 + 0x22 != (int)(char)bVar10));
    }
    rlppos = pcVar13 + 1;
  }
LAB_00127cd0:
  bVar6 = false;
  bVar9 = bVar7;
  goto LAB_001278d5;
}

Assistant:

void ReadBufLine(bool Parse, bool SplitByColon) {
	// if everything else fails (no data, not running, etc), return empty line
	*line = 0;
	bool IsLabel = true;
	// try to read through the buffer and produce new line from it
	while (IsRunning && ReadBufData()) {
		// start of new line (or fake "line" by colon)
		rlppos = line;
		substitutedLine = line;		// also reset "substituted" line to the raw new one
		eolComment = NULL;
		if (colonSubline) {			// starting from colon (creating new fake "line")
			colonSubline = false;	// (can't happen inside block comment)
			*(rlppos++) = ' ';
			IsLabel = false;
		} else {					// starting real new line
			IsLabel = (0 == blockComment);
		}
		bool afterNonAlphaNum, afterNonAlphaNumNext = true;
		// copy data from read buffer into `line` buffer until EOL/colon is found
		while (
				ReadBufData() && '\n' != *rlpbuf && '\r' != *rlpbuf &&	// split by EOL
				// split by colon only on 2nd+ char && SplitByColon && not inside block comment
				(blockComment || !SplitByColon || rlppos == line || ':' != *rlpbuf)) {
			// copy the new character to new line
			*rlppos = *rlpbuf++;
			afterNonAlphaNum = afterNonAlphaNumNext;
			afterNonAlphaNumNext = !isalnum((byte)*rlppos);
			// handle EOL escaping, limited implementation, usage not recommended
			if ('\\' == *rlppos && ReadBufData() && ('\r' == *rlpbuf || '\n' == *rlpbuf))  {
				char CRLFtest = (*rlpbuf++) ^ ('\r'^'\n');	// flip CR->LF || LF->CR (and eats first)
				if (ReadBufData() && CRLFtest == *rlpbuf) ++rlpbuf;	// if CRLF/LFCR pair, eat also second
				sourcePosStack.back().nextSegment();	// mark last line in errors/etc
				continue;								// continue with chars from next line
			}
			// Block comments logic first (anything serious may happen only "outside" of block comment
			if ('*' == *rlppos && ReadBufData() && '/' == *rlpbuf) {
				if (0 < blockComment) --blockComment;	// block comment ends here, -1 from nesting
				++rlppos;	*rlppos++ = *rlpbuf++;		// copy the second char too
				continue;
			}
			if ('/' == *rlppos && ReadBufData() && '*' == *rlpbuf) {
				++rlppos, ++blockComment;				// block comment starts here, nest +1 more
				*rlppos++ = *rlpbuf++;					// copy the second char too
				continue;
			}
			if (blockComment) {							// inside block comment just copy chars
				++rlppos;
				continue;
			}
			// check if still in label area, if yes, copy the finishing colon as char (don't split by it)
			if ((IsLabel = (IsLabel && islabchar(*rlppos)))) {
				++rlppos;					// label character
				//SMC offset handling
				if (ReadBufData() && '+' == *rlpbuf) {	// '+' after label, add it as SMC_offset syntax
					IsLabel = false;
					*rlppos++ = *rlpbuf++;
					if (ReadBufData() && (isdigit(byte(*rlpbuf)) || '*' == *rlpbuf)) *rlppos++ = *rlpbuf++;
				}
				if (ReadBufData() && ':' == *rlpbuf) {	// colon after label, add it
					*rlppos++ = *rlpbuf++;
					IsLabel = false;
				}
				continue;
			}
			// not in label any more, check for EOL comments ";" or "//"
			if ((';' == *rlppos) || ('/' == *rlppos && ReadBufData() && '/' == *rlpbuf)) {
				eolComment = rlppos;
				++rlppos;					// EOL comment ";"
				while (ReadBufData() && '\n' != *rlpbuf && '\r' != *rlpbuf) *rlppos++ = *rlpbuf++;
				continue;
			}
			// check for string literals - double/single quotes
			if (afterNonAlphaNum && ('"' == *rlppos || '\'' == *rlppos)) {
				const bool quotes = '"' == *rlppos;
				int escaped = 0;
				do {
					if (escaped) --escaped;
					++rlppos;				// previous char confirmed
					*rlppos = ReadBufData() ? *rlpbuf : 0;	// copy next char (if available)
					if (!*rlppos || '\r' == *rlppos || '\n' == *rlppos) *rlppos = 0;	// not valid
					else ++rlpbuf;			// buffer char read (accepted)
					if (quotes && !escaped && '\\' == *rlppos) escaped = 2;	// escape sequence detected
				} while (*rlppos && (escaped || (quotes ? '"' : '\'') != *rlppos));
				if (*rlppos) ++rlppos;		// there should be ending "/' in line buffer, confirm it
				continue;
			}
			// anything else just copy
			++rlppos;				// previous char confirmed
		} // while "some char in buffer, and it's not line delimiter"
		// line interrupted somehow, may be correctly finished, check + finalize line and process it
		*rlppos = 0;
		// skip <EOL> char sequence in read buffer
		if (ReadBufData() && ('\r' == *rlpbuf || '\n' == *rlpbuf)) {
			char CRLFtest = (*rlpbuf++) ^ ('\r'^'\n');	// flip CR->LF || LF->CR (and eats first)
			if (ReadBufData() && CRLFtest == *rlpbuf) ++rlpbuf;	// if CRLF/LFCR pair, eat also second
			// if this was very last <EOL> in file (on non-empty line), add one more fake empty line
			if (!ReadBufData() && *line) *rlpbuf_end++ = '\n';	// to make listing files "as before"
		} else {
			// advance over single colon if that was the reason to terminate line parsing
			colonSubline = SplitByColon && ReadBufData() && (':' == *rlpbuf) && ++rlpbuf;
		}
		// do +1 for very first colon-segment only (rest is +1 due to artificial space at beginning)
		assert(!sourcePosStack.empty());
		size_t advanceColumns = colonSubline ? (0 == sourcePosStack.back().colEnd) + strlen(line) : 0;
		sourcePosStack.back().nextSegment(colonSubline, advanceColumns);
		// line is parsed and ready to be processed
		if (Parse) 	ParseLine();	// processed here in loop
		else 		return;			// processed externally
	} // while (IsRunning && ReadBufData())
}